

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

lws * lws_wsi_mux_move_child_to_tail(lws **wsi2)

{
  lws_log_cx *cx;
  char *pcVar1;
  lws *local_18;
  lws *w;
  lws **wsi2_local;
  
  local_18 = *wsi2;
  do {
    if (local_18 == (lws *)0x0) {
LAB_0013a873:
      if (local_18 != (lws *)0x0) {
        (local_18->mux).requested_POLLOUT = '\0';
      }
      return local_18;
    }
    if ((local_18->mux).sibling_list == (lws *)0x0) {
      cx = lwsl_wsi_get_cx(local_18);
      pcVar1 = lws_wsi_tag(*wsi2);
      _lws_log_cx(cx,lws_log_prepend_wsi,local_18,0x10,"lws_wsi_mux_move_child_to_tail",
                  "*wsi2 = %s\n",pcVar1);
      if (local_18 != *wsi2) {
        (local_18->mux).sibling_list = *wsi2;
        *wsi2 = ((*wsi2)->mux).sibling_list;
        (((local_18->mux).sibling_list)->mux).sibling_list = (lws *)0x0;
        local_18 = (local_18->mux).sibling_list;
      }
      goto LAB_0013a873;
    }
    local_18 = (local_18->mux).sibling_list;
  } while( true );
}

Assistant:

struct lws *
lws_wsi_mux_move_child_to_tail(struct lws **wsi2)
{
	struct lws *w = *wsi2;

	while (w) {
		if (!w->mux.sibling_list) { /* w is the current last */
			lwsl_wsi_debug(w, "*wsi2 = %s\n", lws_wsi_tag(*wsi2));

			if (w == *wsi2) /* we are already last */
				break;

			/* last points to us as new last */
			w->mux.sibling_list = *wsi2;

			/* guy pointing to us until now points to
			 * our old next */
			*wsi2 = (*wsi2)->mux.sibling_list;

			/* we point to nothing because we are last */
			w->mux.sibling_list->mux.sibling_list = NULL;

			/* w becomes us */
			w = w->mux.sibling_list;
			break;
		}
		w = w->mux.sibling_list;
	}

	/* clear the waiting for POLLOUT on the guy that was chosen */

	if (w)
		w->mux.requested_POLLOUT = 0;

	return w;
}